

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_joystick.cpp
# Opt level: O2

void __thiscall SDLInputJoystick::SetDefaultConfig(SDLInputJoystick *this)

{
  int iVar1;
  uint uVar2;
  EJoyAxis *pEVar3;
  ulong uVar4;
  AxisInfo local_58;
  
  pEVar3 = DefaultAxes;
  uVar4 = 0;
  while( true ) {
    iVar1 = (*(this->super_IJoystickConfig)._vptr_IJoystickConfig[5])(this);
    if ((long)iVar1 <= (long)uVar4) break;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    local_58.Name.Chars = FString::NullString.Nothing;
    if ((long)uVar4 < (long)this->NumAxes) {
      FString::Format(&local_58.Name,"Axis %d",(ulong)((int)uVar4 + 1));
    }
    else {
      uVar2 = (int)uVar4 - this->NumAxes;
      FString::Format(&local_58.Name,"Hat %d (%c)",(ulong)((int)uVar2 / 2 + 1),
                      (ulong)(uVar2 & 1 | 0x78));
    }
    local_58.DeadZone = 1e-06;
    local_58.Multiplier = 1.0;
    local_58.Value = 0.0;
    local_58.ButtonValue = '\0';
    local_58.GameAxis = JOYAXIS_None;
    if (uVar4 < 5) {
      local_58.GameAxis = *pEVar3;
    }
    TArray<SDLInputJoystick::AxisInfo,_SDLInputJoystick::AxisInfo>::Push(&this->Axes,&local_58);
    FString::~FString(&local_58.Name);
    uVar4 = uVar4 + 1;
    pEVar3 = pEVar3 + 1;
  }
  return;
}

Assistant:

void SetDefaultConfig()
	{
		for(int i = 0;i < GetNumAxes();i++)
		{
			AxisInfo info;
			if(i < NumAxes)
				info.Name.Format("Axis %d", i+1);
			else
				info.Name.Format("Hat %d (%c)", (i-NumAxes)/2 + 1, (i-NumAxes)%2 == 0 ? 'x' : 'y');
			info.DeadZone = MIN_DEADZONE;
			info.Multiplier = 1.0f;
			info.Value = 0.0;
			info.ButtonValue = 0;
			if(i >= 5)
				info.GameAxis = JOYAXIS_None;
			else
				info.GameAxis = DefaultAxes[i];
			Axes.Push(info);
		}
	}